

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

vector<long,_std::allocator<long>_> *
CoreML::defaultSizeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ImageFeatureType *params)

{
  LogMessage *pLVar1;
  SizeRange *pSVar2;
  ImageFeatureType_ImageSizeRange *pIVar3;
  ImageFeatureType_EnumeratedImageSizes *pIVar4;
  iterator iVar5;
  LogFinisher local_99;
  uint64 local_98;
  LogMessage local_90;
  LogMessage local_58;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._0_8_ = params->width_;
  if (((long)local_90._0_8_ < 1) || (params->height_ < 1)) {
    if (params->_oneof_case_[0] == 0x1f) {
      pSVar2 = ((params->SizeFlexibility_).imagesizerange_)->widthrange_;
      if (pSVar2 == (SizeRange *)0x0) {
        pSVar2 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_90._0_8_ = pSVar2->lowerbound_;
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar5,(long *)&local_90);
      }
      else {
        *iVar5._M_current = local_90._0_8_;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      if (params->_oneof_case_[0] == 0x1f) {
        pIVar3 = (params->SizeFlexibility_).imagesizerange_;
      }
      else {
        pIVar3 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
      }
      pSVar2 = pIVar3->heightrange_;
      if (pSVar2 == (SizeRange *)0x0) {
        pSVar2 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      local_98 = pSVar2->lowerbound_;
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_90._0_8_ = local_98;
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar5,(long *)&local_90);
        return __return_storage_ptr__;
      }
    }
    else {
      if (params->_oneof_case_[0] != 0x15) {
        return __return_storage_ptr__;
      }
      pIVar4 = (params->SizeFlexibility_).enumeratedsizes_;
      if ((pIVar4->sizes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar1 = google::protobuf::internal::LogMessage::operator<<
                           (&local_58,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar1);
        google::protobuf::internal::LogMessage::~LogMessage(&local_58);
      }
      local_90._0_8_ =
           *(long *)((long)((pIVar4->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10);
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar5,(long *)&local_90);
      }
      else {
        *iVar5._M_current = local_90._0_8_;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      if (params->_oneof_case_[0] == 0x15) {
        pIVar4 = (params->SizeFlexibility_).enumeratedsizes_;
      }
      else {
        pIVar4 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
      }
      if ((pIVar4->sizes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar1 = google::protobuf::internal::LogMessage::operator<<
                           (&local_90,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar1);
        google::protobuf::internal::LogMessage::~LogMessage(&local_90);
      }
      local_98 = *(uint64 *)
                  ((long)((pIVar4->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
      iVar5._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar5,(long *)&local_98);
        return __return_storage_ptr__;
      }
    }
  }
  else {
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar5,(long *)&local_90);
    }
    else {
      *iVar5._M_current = local_90._0_8_;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    local_98 = params->height_;
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_90._0_8_ = local_98;
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar5,(long *)&local_90);
      return __return_storage_ptr__;
    }
  }
  *iVar5._M_current = local_98;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((uint64 *)iVar5._M_current + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultSizeOf(const Specification::ImageFeatureType &params) {
        std::vector<int64_t> defaultSize;

        if (params.width() > 0 && params.height() > 0) {
            defaultSize.push_back((int64_t)params.width());
            defaultSize.push_back((int64_t)params.height());
            return defaultSize;
        }

        switch (params.SizeFlexibility_case()) {
            case Specification::ImageFeatureType::kEnumeratedSizes:
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).width());
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).height());
                break;
            case Specification::ImageFeatureType::kImageSizeRange:
                defaultSize.push_back((int64_t)params.imagesizerange().widthrange().lowerbound());
                defaultSize.push_back((int64_t)params.imagesizerange().heightrange().lowerbound());
                break;
            case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                break;
        }
        return defaultSize;
    }